

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_core.hpp
# Opt level: O3

void __thiscall
asio::ssl::detail::stream_core::stream_core<asio::any_io_executor>
          (stream_core *this,SSL_CTX *context,any_io_executor *ex)

{
  implementation_type *impl;
  pointer puVar1;
  error_category *peVar2;
  value_type_conflict *__val;
  error_code local_40;
  
  engine::engine(&this->engine_,context);
  asio::detail::
  io_object_impl<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_asio::any_io_executor>
  ::io_object_impl(&(this->pending_read_).impl_,0,ex);
  asio::detail::
  io_object_impl<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_asio::any_io_executor>
  ::io_object_impl(&(this->pending_write_).impl_,0,ex);
  (this->output_buffer_space_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->output_buffer_space_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->output_buffer_space_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar1 = (pointer)operator_new(0x4400);
  (this->output_buffer_space_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = puVar1;
  (this->output_buffer_space_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = puVar1 + 0x4400;
  memset(puVar1,0,0x4400);
  (this->output_buffer_space_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = puVar1 + 0x4400;
  (this->output_buffer_).data_ = puVar1;
  (this->output_buffer_).size_ = 0x4400;
  (this->input_buffer_space_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->input_buffer_space_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->input_buffer_space_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar1 = (pointer)operator_new(0x4400);
  (this->input_buffer_space_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = puVar1;
  (this->input_buffer_space_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = puVar1 + 0x4400;
  memset(puVar1,0,0x4400);
  (this->input_buffer_space_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = puVar1 + 0x4400;
  (this->input_buffer_).data_ = puVar1;
  (this->input_buffer_).size_ = 0x4400;
  (this->input_).data_ = (void *)0x0;
  (this->input_).size_ = 0;
  local_40._M_value = 0;
  peVar2 = (error_category *)std::_V2::system_category();
  local_40._M_cat = peVar2;
  asio::detail::
  deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  ::cancel((this->pending_read_).impl_.service_,&(this->pending_read_).impl_.implementation_,
           &local_40);
  (this->pending_read_).impl_.implementation_.expiry.__d.__r = -0x8000000000000000;
  local_40._M_value = 0;
  impl = &(this->pending_write_).impl_.implementation_;
  local_40._M_cat = peVar2;
  asio::detail::
  deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  ::cancel((this->pending_write_).impl_.service_,impl,&local_40);
  (impl->expiry).__d.__r = -0x8000000000000000;
  return;
}

Assistant:

stream_core(SSL_CTX* context, const Executor& ex)
    : engine_(context),
      pending_read_(ex),
      pending_write_(ex),
      output_buffer_space_(max_tls_record_size),
      output_buffer_(asio::buffer(output_buffer_space_)),
      input_buffer_space_(max_tls_record_size),
      input_buffer_(asio::buffer(input_buffer_space_))
  {
    pending_read_.expires_at(neg_infin());
    pending_write_.expires_at(neg_infin());
  }